

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

_Bool match_pasv_6nums(char *p,uint *array)

{
  uint *local_38;
  char *endp;
  unsigned_long num;
  uint *puStack_20;
  int i;
  uint *array_local;
  char *p_local;
  
  num._4_4_ = 0;
  puStack_20 = array;
  array_local = (uint *)p;
  while( true ) {
    if (5 < num._4_4_) {
      return true;
    }
    if (num._4_4_ != 0) {
      if ((char)*array_local != ',') {
        return false;
      }
      array_local = (uint *)((long)array_local + 1);
    }
    if (((char)*array_local < '0') || ('9' < (char)*array_local)) break;
    endp = (char *)strtoul((char *)array_local,(char **)&local_38,10);
    if ((char *)0xff < endp) {
      return false;
    }
    puStack_20[num._4_4_] = (uint)endp;
    array_local = local_38;
    num._4_4_ = num._4_4_ + 1;
  }
  return false;
}

Assistant:

static bool match_pasv_6nums(const char *p,
                             unsigned int *array) /* 6 numbers */
{
  int i;
  for(i = 0; i < 6; i++) {
    unsigned long num;
    char *endp;
    if(i) {
      if(*p != ',')
        return FALSE;
      p++;
    }
    if(!ISDIGIT(*p))
      return FALSE;
    num = strtoul(p, &endp, 10);
    if(num > 255)
      return FALSE;
    array[i] = (unsigned int)num;
    p = endp;
  }
  return TRUE;
}